

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

void capnp::_::WireHelpers::transferPointer
               (SegmentBuilder *dstSegment,WirePointer *dst,SegmentBuilder *srcSegment,
               WirePointer *srcTag,word *srcPtr)

{
  uint uVar1;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aVar2;
  word *result;
  word *pwVar3;
  AllocateResult AVar4;
  
  if (dstSegment == srcSegment) {
    uVar1 = (srcTag->offsetAndKind).value & 3;
    if ((uVar1 == 0) &&
       ((srcTag->field_1).structRef.ptrCount.value == 0 &&
        (srcTag->field_1).structRef.dataSize.value == 0)) {
      uVar1 = 0xfffffffc;
    }
    else {
      uVar1 = (uVar1 + ((uint)((ulong)((long)srcPtr - (long)dst) >> 1) & 0xfffffffc)) - 4;
    }
    (dst->offsetAndKind).value = uVar1;
    aVar2 = srcTag->field_1;
  }
  else {
    pwVar3 = srcSegment->pos;
    if (((long)((long)(srcSegment->super_SegmentReader).ptr.ptr +
               ((srcSegment->super_SegmentReader).ptr.size_ * 8 - (long)pwVar3)) < 8) ||
       (srcSegment->pos = pwVar3 + 1, pwVar3 == (word *)0x0)) {
      AVar4 = BuilderArena::allocate((BuilderArena *)(srcSegment->super_SegmentReader).arena,2);
      pwVar3 = AVar4.words;
      *(uint *)&pwVar3->content =
           (int)srcPtr - *(int *)&(srcSegment->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
      *(uint *)((long)&pwVar3->content + 4) = (srcSegment->super_SegmentReader).id.value;
      *(uint *)&pwVar3[1].content = (srcTag->offsetAndKind).value & 3;
      *(anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)&pwVar3[1].content + 4) = srcTag->field_1
      ;
      (dst->offsetAndKind).value =
           (int)AVar4.words - *(int *)&((AVar4.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U
           | 6;
      aVar2 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
              ((AVar4.segment)->super_SegmentReader).id.value;
    }
    else {
      *(uint *)&pwVar3->content =
           ((srcTag->offsetAndKind).value & 3) +
           ((uint)((ulong)((long)srcPtr - (long)pwVar3) >> 1) & 0xfffffffc) + -4;
      *(anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)&pwVar3->content + 4) = srcTag->field_1;
      (dst->offsetAndKind).value =
           (int)pwVar3 - *(int *)&(srcSegment->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
      aVar2 = (anon_union_4_5_35ddcec3_for_WirePointer_1)(srcSegment->super_SegmentReader).id.value;
    }
  }
  dst->field_1 = aVar2;
  return;
}

Assistant:

static void transferPointer(SegmentBuilder* dstSegment, WirePointer* dst,
                              SegmentBuilder* srcSegment, const WirePointer* srcTag,
                              word* srcPtr) {
    // Like the other overload, but splits src into a tag and a target.  Particularly useful for
    // OrphanBuilder.

    if (dstSegment == srcSegment) {
      // Same segment, so create a direct pointer.

      if (srcTag->kind() == WirePointer::STRUCT && srcTag->structRef.wordSize() == ZERO * WORDS) {
        dst->setKindAndTargetForEmptyStruct();
      } else {
        dst->setKindAndTarget(srcTag->kind(), srcPtr, dstSegment);
      }

      // We can just copy the upper 32 bits.  (Use memcpy() to comply with aliasing rules.)
      copyMemory(&dst->upper32Bits, &srcTag->upper32Bits);
    } else {
      // Need to create a far pointer.  Try to allocate it in the same segment as the source, so
      // that it doesn't need to be a double-far.

      WirePointer* landingPad =
          reinterpret_cast<WirePointer*>(srcSegment->allocate(G(1) * WORDS));
      if (landingPad == nullptr) {
        // Darn, need a double-far.
        auto allocation = srcSegment->getArena()->allocate(G(2) * WORDS);
        SegmentBuilder* farSegment = allocation.segment;
        landingPad = reinterpret_cast<WirePointer*>(allocation.words);

        landingPad[0].setFar(false, srcSegment->getOffsetTo(srcPtr));
        landingPad[0].farRef.segmentId.set(srcSegment->getSegmentId());

        landingPad[1].setKindWithZeroOffset(srcTag->kind());
        copyMemory(&landingPad[1].upper32Bits, &srcTag->upper32Bits);

        dst->setFar(true, farSegment->getOffsetTo(reinterpret_cast<word*>(landingPad)));
        dst->farRef.set(farSegment->getSegmentId());
      } else {
        // Simple landing pad is just a pointer.
        landingPad->setKindAndTarget(srcTag->kind(), srcPtr, srcSegment);
        copyMemory(&landingPad->upper32Bits, &srcTag->upper32Bits);

        dst->setFar(false, srcSegment->getOffsetTo(reinterpret_cast<word*>(landingPad)));
        dst->farRef.set(srcSegment->getSegmentId());
      }
    }
  }